

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GdlRuleTable::DebugEngineCode
          (GdlRuleTable *this,GrcManager *pcman,uint32_t fxdRuleVersion,ostream *strmOut)

{
  pointer ppGVar1;
  ostream *poVar2;
  size_t ippass;
  ulong uVar3;
  string local_50;
  
  poVar2 = std::operator<<(strmOut,"\nTABLE: ");
  GrcSymbolTableEntry::FullName_abi_cxx11_(&local_50,this->m_psymName);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_50);
  for (uVar3 = 0;
      ppGVar1 = (this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->m_vppass).
                            super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3);
      uVar3 = uVar3 + 1) {
    GdlPass::DebugEngineCode(ppGVar1[uVar3],pcman,fxdRuleVersion,strmOut);
  }
  return;
}

Assistant:

void GdlRuleTable::DebugEngineCode(GrcManager * pcman, uint32_t fxdRuleVersion, std::ostream & strmOut)
{
	strmOut << "\nTABLE: " << m_psymName->FullName() << "\n";
	for (size_t ippass = 0; ippass < m_vppass.size(); ippass++)
	{
		m_vppass[ippass]->DebugEngineCode(pcman, fxdRuleVersion, strmOut);
	}
}